

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DT_TriEdge.cpp
# Opt level: O0

bool __thiscall
sch::Depth_Edge::silhouette
          (Depth_Edge *this,Vector3 *verts,Index_t index,Depth_TriangleStore *triangleStore)

{
  Depth_Triangle *pDVar1;
  Index_t IVar2;
  Vector3 *pVVar3;
  bool bVar4;
  Index_t IVar5;
  Index_t IVar6;
  int iVar7;
  Depth_Edge *pDVar8;
  Depth_Edge local_80;
  Depth_Triangle *local_70;
  Depth_Triangle *triangle_2;
  Depth_Triangle *local_58;
  Depth_Triangle *triangle_1;
  undefined1 local_48 [4];
  int backup;
  Depth_Triangle *local_38;
  Depth_Triangle *triangle;
  Depth_TriangleStore *triangleStore_local;
  Vector3 *pVStack_20;
  Index_t index_local;
  Vector3 *verts_local;
  Depth_Edge *this_local;
  
  triangle = triangleStore->m_triangles;
  triangleStore_local._6_2_ = index;
  pVStack_20 = verts;
  verts_local = (Vector3 *)this;
  bVar4 = Depth_Triangle::isObsolete(this->m_triangle);
  if (!bVar4) {
    bVar4 = Depth_Triangle::isVisibleFrom(this->m_triangle,pVStack_20,triangleStore_local._6_2_);
    pVVar3 = pVStack_20;
    IVar2 = triangleStore_local._6_2_;
    pDVar1 = triangle;
    if (!bVar4) {
      IVar5 = getTarget(this);
      IVar6 = getSource(this);
      local_38 = Depth_TriangleStore::newTriangle
                           ((Depth_TriangleStore *)pDVar1,pVVar3,IVar2,IVar5,IVar6);
      if (local_38 != (Depth_Triangle *)0x0) {
        Depth_Edge((Depth_Edge *)local_48,local_38,1);
        half_link((Depth_Edge *)local_48,this);
        return true;
      }
      return false;
    }
    Depth_Triangle::setObsolete(this->m_triangle,true);
    triangle_1._4_4_ = Depth_TriangleStore::getFree((Depth_TriangleStore *)triangle);
    pDVar1 = this->m_triangle;
    iVar7 = circ_next(this->m_index);
    pDVar8 = Depth_Triangle::getAdjEdge(pDVar1,iVar7);
    bVar4 = silhouette(pDVar8,pVStack_20,triangleStore_local._6_2_,(Depth_TriangleStore *)triangle);
    if (!bVar4) {
      Depth_Triangle::setObsolete(this->m_triangle,false);
      pVVar3 = pVStack_20;
      IVar2 = triangleStore_local._6_2_;
      pDVar1 = triangle;
      IVar5 = getTarget(this);
      IVar6 = getSource(this);
      local_58 = Depth_TriangleStore::newTriangle
                           ((Depth_TriangleStore *)pDVar1,pVVar3,IVar2,IVar5,IVar6);
      if (local_58 != (Depth_Triangle *)0x0) {
        Depth_Edge((Depth_Edge *)&triangle_2,local_58,1);
        half_link((Depth_Edge *)&triangle_2,this);
        return true;
      }
      return false;
    }
    pDVar1 = this->m_triangle;
    iVar7 = circ_prev(this->m_index);
    pDVar8 = Depth_Triangle::getAdjEdge(pDVar1,iVar7);
    bVar4 = silhouette(pDVar8,pVStack_20,triangleStore_local._6_2_,(Depth_TriangleStore *)triangle);
    if (!bVar4) {
      Depth_Triangle::setObsolete(this->m_triangle,false);
      Depth_TriangleStore::setFree((Depth_TriangleStore *)triangle,triangle_1._4_4_);
      pVVar3 = pVStack_20;
      IVar2 = triangleStore_local._6_2_;
      pDVar1 = triangle;
      IVar5 = getTarget(this);
      IVar6 = getSource(this);
      local_70 = Depth_TriangleStore::newTriangle
                           ((Depth_TriangleStore *)pDVar1,pVVar3,IVar2,IVar5,IVar6);
      if (local_70 != (Depth_Triangle *)0x0) {
        Depth_Edge(&local_80,local_70,1);
        half_link(&local_80,this);
        return true;
      }
      return false;
    }
  }
  return true;
}

Assistant:

bool Depth_Edge::silhouette(const Vector3 * verts, Index_t index, Depth_TriangleStore & triangleStore) const
{
  if(!m_triangle->isObsolete())
  {
    if(!m_triangle->isVisibleFrom(verts, index))
    {
      Depth_Triangle * triangle = triangleStore.newTriangle(verts, index, getTarget(), getSource());

      if(triangle)
      {
        half_link(Depth_Edge(triangle, 1), *this);
        return true;
      }

      return false;
    }
    else
    {
      m_triangle->setObsolete(true); // Triangle is visible

      int backup = triangleStore.getFree();

      if(!m_triangle->getAdjEdge(circ_next(m_index)).silhouette(verts, index, triangleStore))
      {
        m_triangle->setObsolete(false);

        Depth_Triangle * triangle = triangleStore.newTriangle(verts, index, getTarget(), getSource());

        if(triangle)
        {
          half_link(Depth_Edge(triangle, 1), *this);
          return true;
        }

        return false;
      }
      else if(!m_triangle->getAdjEdge(circ_prev(m_index)).silhouette(verts, index, triangleStore))
      {
        m_triangle->setObsolete(false);

        triangleStore.setFree(backup);

        Depth_Triangle * triangle = triangleStore.newTriangle(verts, index, getTarget(), getSource());

        if(triangle)
        {
          half_link(Depth_Edge(triangle, 1), *this);
          return true;
        }

        return false;
      }
    }
  }

  return true;
}